

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O2

void CPU::WDC65816::ProcessorStorageConstructor::relative
               (AccessType param_1,bool param_2,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementPC);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationPerform);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchPreviousPCThrowaway);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchPreviousPCThrowaway);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationCopyDataToPC);
  return;
}

Assistant:

static void relative(AccessType, bool, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);		// Offset.

		target(OperationPerform);			// The branch instructions will skip zero, one or three
											// of the next cycles, depending on the effect of
											// the jump. They'll also calculate the correct target
											// address, placing it into the data buffer.

		target(CycleFetchPreviousPCThrowaway);	// IO.
		target(CycleFetchPreviousPCThrowaway);	// IO.

		target(OperationCopyDataToPC);			// Install the address that was calculated above.
	}